

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O0

void brotli::EncodeContextMap
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *context_map,size_t num_clusters
               ,size_t *storage_ix,uint8_t *storage)

{
  pointer *ppuVar1;
  pointer *this;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  ulong local_830;
  size_t i_1;
  EntropyCodeContextMap symbol_code;
  bool use_rle;
  size_t i;
  HistogramContextMap symbol_histogram;
  uint32_t local_74;
  undefined1 local_70 [4];
  uint32_t max_run_length_prefix;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_bits;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rle_symbols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> transformed_symbols;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t num_clusters_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *context_map_local;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    ppuVar1 = &rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    MoveToFrontTransform((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,context_map)
    ;
    this = &extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    local_74 = 6;
    RunLengthCodeZeros((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,&local_74,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    Histogram<272>::Histogram((Histogram<272> *)&i);
    for (stack0xfffffffffffffb20 = 0; uVar4 = stack0xfffffffffffffb20,
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &extra_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), uVar4 < sVar5;
        register0x00000000 = stack0xfffffffffffffb20 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &extra_bits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,stack0xfffffffffffffb20);
      Histogram<272>::Add((Histogram<272> *)&i,(ulong)*pvVar6);
    }
    symbol_code.symbols_[2]._3_1_ = local_74 != 0;
    WriteBits(1,(ulong)symbol_code.symbols_[2]._3_1_,storage_ix,storage);
    if ((symbol_code.symbols_[2]._3_1_ & 1) != 0) {
      WriteBits(4,(ulong)(local_74 - 1),storage_ix,storage);
    }
    memset(&i_1,0,0x110);
    memset(symbol_code.depth_ + 0x108,0,0x220);
    BuildAndStoreHuffmanTree
              ((uint32_t *)&i,num_clusters + local_74,(uint8_t *)&i_1,
               (uint16_t *)(symbol_code.depth_ + 0x108),storage_ix,storage);
    for (local_830 = 0;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &extra_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), local_830 < sVar5;
        local_830 = local_830 + 1) {
      ppuVar1 = &extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,local_830);
      bVar2 = symbol_code.depth_[(ulong)*pvVar6 - 8];
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,local_830);
      WriteBits((ulong)bVar2,(ulong)symbol_code.bits_[(ulong)*pvVar6 - 4],storage_ix,storage);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &extra_bits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_830);
      if ((*pvVar6 != 0) &&
         (pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &extra_bits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,local_830),
         *pvVar6 <= local_74)) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &extra_bits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,local_830);
        uVar3 = *pvVar6;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                            local_830);
        WriteBits((ulong)uVar3,(ulong)*pvVar6,storage_ix,storage);
      }
    }
    WriteBits(1,1,storage_ix,storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &extra_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &rle_symbols.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void EncodeContextMap(const std::vector<uint32_t>& context_map,
                      size_t num_clusters,
                      size_t* storage_ix, uint8_t* storage) {
  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  std::vector<uint32_t> transformed_symbols = MoveToFrontTransform(context_map);
  std::vector<uint32_t> rle_symbols;
  std::vector<uint32_t> extra_bits;
  uint32_t max_run_length_prefix = 6;
  RunLengthCodeZeros(transformed_symbols, &max_run_length_prefix,
                     &rle_symbols, &extra_bits);
  HistogramContextMap symbol_histogram;
  for (size_t i = 0; i < rle_symbols.size(); ++i) {
    symbol_histogram.Add(rle_symbols[i]);
  }
  bool use_rle = max_run_length_prefix > 0;
  WriteBits(1, use_rle, storage_ix, storage);
  if (use_rle) {
    WriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
  }
  EntropyCodeContextMap symbol_code;
  memset(symbol_code.depth_, 0, sizeof(symbol_code.depth_));
  memset(symbol_code.bits_, 0, sizeof(symbol_code.bits_));
  BuildAndStoreHuffmanTree(symbol_histogram.data_,
                           num_clusters + max_run_length_prefix,
                           symbol_code.depth_, symbol_code.bits_,
                           storage_ix, storage);
  for (size_t i = 0; i < rle_symbols.size(); ++i) {
    WriteBits(symbol_code.depth_[rle_symbols[i]],
              symbol_code.bits_[rle_symbols[i]],
              storage_ix, storage);
    if (rle_symbols[i] > 0 && rle_symbols[i] <= max_run_length_prefix) {
      WriteBits(rle_symbols[i], extra_bits[i], storage_ix, storage);
    }
  }
  WriteBits(1, 1, storage_ix, storage);  // use move-to-front
}